

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O1

JavascriptError *
Js::JavascriptError::CreateFromCompileScriptException
          (ScriptContext *scriptContext,CompileScriptException *cse,WCHAR *sourceUrl)

{
  char16 *content;
  code *pcVar1;
  bool bVar2;
  ErrorTypeEnum errorType;
  JavascriptError *instance;
  JavascriptString *pJVar3;
  uint64 uVar4;
  uint64 uVar5;
  undefined4 *puVar6;
  double dVar7;
  
  errorType = MapParseError((cse->super_ScriptException).ei.scode);
  instance = MapError(scriptContext,errorType);
  content = (cse->super_ScriptException).ei.bstrDescription;
  if (content != (char16 *)0x0) {
    pJVar3 = JavascriptString::NewCopySz(content,scriptContext);
    JavascriptOperators::OP_SetProperty
              (instance,0x102,pJVar3,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  if (cse->hasLineNumberInfo == true) {
    dVar7 = (double)cse->line;
    uVar4 = NumberUtilities::ToSpecial(dVar7);
    bVar2 = NumberUtilities::IsNan(dVar7);
    if (bVar2) {
      uVar5 = NumberUtilities::ToSpecial(dVar7);
      if (uVar5 != 0xfff8000000000000) {
        uVar5 = NumberUtilities::ToSpecial(dVar7);
        if (uVar5 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) goto LAB_00bcf981;
          *puVar6 = 0;
        }
      }
    }
    JavascriptOperators::OP_SetProperty
              (instance,0xf7,(Var)(uVar4 ^ 0xfffc000000000000),scriptContext,
               (PropertyValueInfo *)0x0,PropertyOperation_None,(Var)0x0);
  }
  if (cse->hasLineNumberInfo == true) {
    dVar7 = (double)((cse->super_ScriptException).ichMin - cse->ichMinLine);
    uVar4 = NumberUtilities::ToSpecial(dVar7);
    bVar2 = NumberUtilities::IsNan(dVar7);
    if (bVar2) {
      uVar5 = NumberUtilities::ToSpecial(dVar7);
      if (uVar5 != 0xfff8000000000000) {
        uVar5 = NumberUtilities::ToSpecial(dVar7);
        if (uVar5 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) goto LAB_00bcf981;
          *puVar6 = 0;
        }
      }
    }
    JavascriptOperators::OP_SetProperty
              (instance,0x2d2,(Var)(uVar4 ^ 0xfffc000000000000),scriptContext,
               (PropertyValueInfo *)0x0,PropertyOperation_None,(Var)0x0);
  }
  if (cse->hasLineNumberInfo == true) {
    dVar7 = (double)((cse->super_ScriptException).ichLim - (cse->super_ScriptException).ichMin);
    uVar4 = NumberUtilities::ToSpecial(dVar7);
    bVar2 = NumberUtilities::IsNan(dVar7);
    if (bVar2) {
      uVar5 = NumberUtilities::ToSpecial(dVar7);
      if (uVar5 != 0xfff8000000000000) {
        uVar5 = NumberUtilities::ToSpecial(dVar7);
        if (uVar5 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
LAB_00bcf981:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
      }
    }
    JavascriptOperators::OP_SetProperty
              (instance,0xd1,(Var)(uVar4 ^ 0xfffc000000000000),scriptContext,
               (PropertyValueInfo *)0x0,PropertyOperation_None,(Var)0x0);
  }
  if (cse->bstrLine != (char16 *)0x0) {
    pJVar3 = JavascriptString::NewCopySz(cse->bstrLine,scriptContext);
    JavascriptOperators::OP_SetProperty
              (instance,0x153,pJVar3,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  if (sourceUrl != (WCHAR *)0x0) {
    pJVar3 = JavascriptString::NewCopySz(sourceUrl,scriptContext);
    JavascriptOperators::OP_SetProperty
              (instance,0x2d3,pJVar3,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  return instance;
}

Assistant:

JavascriptError* JavascriptError::CreateFromCompileScriptException(ScriptContext* scriptContext, CompileScriptException* cse, const WCHAR * sourceUrl)
    {
        HRESULT hr = cse->ei.scode;
        Js::JavascriptError * error = Js::JavascriptError::MapParseError(scriptContext, hr);
        Var value;

        if (cse->ei.bstrDescription)
        {
            value = JavascriptString::NewCopySz(cse->ei.bstrDescription, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::message, value, scriptContext);
        }

        if (cse->hasLineNumberInfo)
        {
            value = JavascriptNumber::New(cse->line, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::line, value, scriptContext);
        }

        if (cse->hasLineNumberInfo)
        {
            value = JavascriptNumber::New(cse->ichMin - cse->ichMinLine, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::column, value, scriptContext);
        }

        if (cse->hasLineNumberInfo)
        {
            value = JavascriptNumber::New(cse->ichLim - cse->ichMin, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::length, value, scriptContext);
        }

        if (cse->bstrLine != nullptr)
        {
            value = JavascriptString::NewCopySz(cse->bstrLine, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::source, value, scriptContext);
        }

        if (sourceUrl != nullptr)
        {
            value = JavascriptString::NewCopySz(sourceUrl, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::url, value, scriptContext);
        }

        return error;
    }